

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cse.c
# Opt level: O3

void dmrC_cleanup_and_cse(dmr_C *C,entrypoint *ep)

{
  int *piVar1;
  instruction_list *head;
  basic_block *pbVar2;
  undefined8 alloc;
  uint uVar3;
  int iVar4;
  basic_block *pbVar5;
  instruction *piVar6;
  undefined1 *puVar7;
  instruction *piVar8;
  basic_block *pbVar9;
  void *ptr;
  linearizer_state_t *plVar10;
  unsigned_long uVar11;
  undefined1 *puVar12;
  long lVar13;
  instruction *insn;
  instruction *piVar14;
  instruction_list **ppiVar15;
  instruction *insn_00;
  ptr_list_iter local_a8;
  ptr_list_iter local_90;
  long local_78;
  instruction_list **local_70;
  basic_block *local_68;
  undefined1 local_60 [8];
  ptr_list_iter bbiter__;
  
  dmrC_simplify_memops(C,ep);
  bbiter__._16_8_ = &C->ptrlist_allocator;
  plVar10 = C->L;
  do {
    plVar10->repeat_phase = 0;
    ptrlist_forward_iterator((ptr_list_iter *)local_60,(ptr_list *)ep->bbs);
    pbVar5 = (basic_block *)ptrlist_iter_next((ptr_list_iter *)local_60);
    while (pbVar5 != (basic_block *)0x0) {
      ptrlist_forward_iterator(&local_90,(ptr_list *)pbVar5->insns);
      piVar6 = (instruction *)ptrlist_iter_next(&local_90);
      while (piVar6 != (instruction *)0x0) {
        if (piVar6->bb != (basic_block *)0x0) {
          if (piVar6->bb != pbVar5) {
            __assert_fail("insn->bb == bb",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/cse.c"
                          ,0x28,
                          "void clean_up_one_instruction(struct dmr_C *, struct basic_block *, struct instruction *)"
                         );
          }
          uVar3 = dmrC_simplify_instruction(C,piVar6);
          plVar10 = C->L;
          plVar10->repeat_phase = plVar10->repeat_phase | uVar3;
          if (piVar6->bb != (basic_block *)0x0) {
            uVar3 = *(uint *)piVar6 & 0xff;
            puVar12 = (undefined1 *)(ulong)((*(uint *)piVar6 >> 0xb) + uVar3 * 8);
            if (uVar3 - 9 < 0x1a) goto switchD_0012ba94_caseD_30;
            switch(uVar3) {
            case 0x25:
              puVar12 = (undefined1 *)((long)&((piVar6->field_6).field_6.src3)->nr + (long)puVar12);
            case 0x30:
            case 0x31:
            case 0x33:
switchD_0012ba94_caseD_30:
              puVar12 = &(((piVar6->field_6).field_1.bb_false)->pos).field_0x0 + (long)puVar12;
            case 0x23:
            case 0x24:
            case 0x2c:
              puVar12 = &(((piVar6->field_6).field_1.bb_true)->pos).field_0x0 + (long)puVar12;
              break;
            default:
              goto switchD_0012ba94_caseD_26;
            case 0x2b:
              puVar12 = &(((piVar6->field_6).field_1.bb_false)->pos).field_0x0 + (long)puVar12;
              break;
            case 0x2e:
              ptrlist_forward_iterator(&local_a8,(ptr_list *)(piVar6->field_6).field_1.bb_true);
              puVar7 = (undefined1 *)ptrlist_iter_next(&local_a8);
              while (puVar7 != (undefined1 *)0x0) {
                if (((pseudo *)puVar7 != &C->L->void_pseudo) &&
                   (lVar13 = *(long *)(puVar7 + 0x20), lVar13 != 0)) {
                  puVar12 = puVar12 + *(long *)(lVar13 + 8) + *(long *)(lVar13 + 0x28);
                }
                puVar7 = (undefined1 *)ptrlist_iter_next(&local_a8);
              }
              plVar10 = C->L;
            }
            ptrlist_add((ptr_list **)
                        (plVar10->insn_hash_table +
                        (((uint)((ulong)puVar12 >> 0x10) & 0xffff) + (int)puVar12 & 0xff)),piVar6,
                        (allocator *)bbiter__._16_8_);
          }
        }
switchD_0012ba94_caseD_26:
        piVar6 = (instruction *)ptrlist_iter_next(&local_90);
      }
      pbVar5 = (basic_block *)ptrlist_iter_next((ptr_list_iter *)local_60);
    }
    if ((C->L->repeat_phase & 3) != 0) {
      dmrC_kill_unreachable_bbs(C,ep);
    }
    lVar13 = 0;
    do {
      head = C->L->insn_hash_table[lVar13];
      if (head != (instruction_list *)0x0) {
        ppiVar15 = C->L->insn_hash_table + lVar13;
        iVar4 = ptrlist_size((ptr_list *)head);
        if (1 < iVar4) {
          local_78 = lVar13;
          ptrlist_sort((ptr_list **)ppiVar15,C,insn_compare);
          local_70 = ppiVar15;
          ptrlist_forward_iterator((ptr_list_iter *)local_60,(ptr_list *)*ppiVar15);
          piVar6 = (instruction *)ptrlist_iter_next((ptr_list_iter *)local_60);
          lVar13 = local_78;
          ppiVar15 = local_70;
          if (piVar6 != (instruction *)0x0) {
            insn = (instruction *)0x0;
            do {
              piVar14 = insn;
              if (((piVar6->bb != (basic_block *)0x0) &&
                  (piVar14 = piVar6, insn != (instruction *)0x0)) &&
                 (iVar4 = insn_compare(C,insn,piVar6), iVar4 == 0)) {
                pbVar5 = insn->bb;
                pbVar2 = piVar6->bb;
                if (pbVar5 == pbVar2) {
                  ptrlist_forward_iterator(&local_a8,(ptr_list *)pbVar5->insns);
                  do {
                    piVar8 = (instruction *)ptrlist_iter_next(&local_a8);
                    if (piVar8 == (instruction *)0x0) {
                      dmrC_warning(C,pbVar5->pos,"Whaa? unable to find CSE instructions");
                      piVar14 = insn;
                      goto LAB_0012bbc5;
                    }
                    piVar14 = insn;
                    insn_00 = piVar6;
                  } while ((piVar8 != insn) && (piVar14 = piVar6, insn_00 = insn, piVar8 != piVar6))
                  ;
                  dmrC_convert_instruction_target(C,insn_00,(piVar14->field_5).target);
                  dmrC_kill_insn(C,insn_00,0);
                  piVar1 = &C->L->repeat_phase;
                  *piVar1 = *piVar1 | 1;
                }
                else {
                  uVar11 = C->L->bb_generation + 1;
                  C->L->bb_generation = uVar11;
                  iVar4 = bb_dominates(ep,pbVar5,pbVar2,uVar11);
                  if (iVar4 == 0) {
                    uVar11 = C->L->bb_generation + 1;
                    C->L->bb_generation = uVar11;
                    iVar4 = bb_dominates(ep,pbVar2,pbVar5,uVar11);
                    if (iVar4 == 0) {
                      iVar4 = ptrlist_size((ptr_list *)pbVar5->parents);
                      piVar14 = insn;
                      if (iVar4 == 1) {
                        local_68 = (basic_block *)ptrlist_first((ptr_list *)pbVar5->parents);
                        iVar4 = ptrlist_size((ptr_list *)pbVar2->parents);
                        if (((iVar4 == 1) &&
                            (pbVar9 = (basic_block *)ptrlist_first((ptr_list *)pbVar2->parents),
                            pbVar2 = local_68, local_68 != (basic_block *)0x0)) &&
                           (pbVar9 == local_68)) {
                          dmrC_convert_instruction_target(C,piVar6,(insn->field_5).target);
                          dmrC_kill_insn(C,piVar6,0);
                          piVar1 = &C->L->repeat_phase;
                          *piVar1 = *piVar1 | 1;
                          ptrlist_remove((ptr_list **)&pbVar5->insns,insn,1);
                          ppiVar15 = &pbVar2->insns;
                          ptr = ptrlist_undo_last((ptr_list **)ppiVar15);
                          alloc = bbiter__._16_8_;
                          insn->bb = pbVar2;
                          ptrlist_add((ptr_list **)ppiVar15,insn,(allocator *)bbiter__._16_8_);
                          ptrlist_add((ptr_list **)ppiVar15,ptr,(allocator *)alloc);
                        }
                      }
                    }
                    else {
                      dmrC_convert_instruction_target(C,insn,(piVar6->field_5).target);
                      dmrC_kill_insn(C,insn,0);
                      piVar1 = &C->L->repeat_phase;
                      *piVar1 = *piVar1 | 1;
                    }
                  }
                  else {
                    dmrC_convert_instruction_target(C,piVar6,(insn->field_5).target);
                    dmrC_kill_insn(C,piVar6,0);
                    piVar1 = &C->L->repeat_phase;
                    *piVar1 = *piVar1 | 1;
                    piVar14 = insn;
                  }
                }
              }
LAB_0012bbc5:
              piVar6 = (instruction *)ptrlist_iter_next((ptr_list_iter *)local_60);
              lVar13 = local_78;
              insn = piVar14;
              ppiVar15 = local_70;
            } while (piVar6 != (instruction *)0x0);
          }
        }
        ptrlist_remove_all((ptr_list **)ppiVar15);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x100);
    plVar10 = C->L;
    uVar3 = plVar10->repeat_phase;
    if ((uVar3 & 2) != 0) {
      dmrC_simplify_memops(C,ep);
      plVar10 = C->L;
      uVar3 = plVar10->repeat_phase;
    }
    if ((uVar3 & 1) == 0) {
      return;
    }
  } while( true );
}

Assistant:

void dmrC_cleanup_and_cse(struct dmr_C *C, struct entrypoint *ep)
{
	int i;

	dmrC_simplify_memops(C, ep);
repeat:
	C->L->repeat_phase = 0;
	clean_up_insns(C, ep);
	if (C->L->repeat_phase & REPEAT_CFG_CLEANUP)
		dmrC_kill_unreachable_bbs(C, ep);
	for (i = 0; i < INSN_HASH_SIZE; i++) {
		struct instruction_list **list = C->L->insn_hash_table + i;
		if (*list) {
			if (dmrC_instruction_list_size(*list) > 1) {
				struct instruction *insn, *last;

				sort_instruction_list(C, list);

				last = NULL;
				FOR_EACH_PTR(*list, insn) {
					if (!insn->bb)
						continue;
					if (last) {
						if (!insn_compare(C, last, insn))
							insn = try_to_cse(C, ep, last, insn);
					}
					last = insn;
				} END_FOR_EACH_PTR(insn);
			}
			ptrlist_remove_all((struct ptr_list **)list);
		}
	}

	if (C->L->repeat_phase & REPEAT_SYMBOL_CLEANUP)
		dmrC_simplify_memops(C, ep);

	if (C->L->repeat_phase & REPEAT_CSE)
		goto repeat;
}